

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

void __thiscall
MeCab::EncoderFeatureIndex::shrink
          (EncoderFeatureIndex *this,size_t freq,vector<double,_std::allocator<double>_> *observed)

{
  _Rb_tree_header *p_Var1;
  size_t sVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *pmVar3;
  _Rb_tree_node_base *p_Var4;
  iterator iVar5;
  iterator __position;
  _Base_ptr p_Var6;
  int *piVar7;
  size_t i_1;
  size_t i;
  ulong uVar8;
  key_type_conflict *pkVar9;
  _Self __tmp;
  key_type_conflict *__k;
  vector<double,_std::allocator<double>_> observed_new;
  vector<unsigned_long,_std::allocator<unsigned_long>_> freqv;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> old2new;
  key_type_conflict local_b4;
  EncoderFeatureIndex *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  _Vector_base<double,_std::allocator<double>_> local_a0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
  *local_68;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  
  local_88._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8 = observed;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_88,
             (this->super_FeatureIndex).maxid_);
  for (p_Var4 = *(_Rb_tree_node_base **)&this->field_0x1b8;
      p_Var4 != (_Rb_tree_node_base *)&this->field_0x1a8;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    for (piVar7 = *(int **)(p_Var4 + 2); (long)*piVar7 != -1; piVar7 = piVar7 + 1) {
      local_88._M_impl.super__Vector_impl_data._M_start[*piVar7] =
           (long)&(p_Var4[2]._M_parent)->_M_color +
           local_88._M_impl.super__Vector_impl_data._M_start[*piVar7];
    }
  }
  if (1 < freq) {
    (this->super_FeatureIndex).maxid_ = 0;
    p_Var1 = &local_60._M_impl.super__Rb_tree_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar8 = 0;
    local_b0 = this;
    local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; uVar8 < (ulong)((long)local_88._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_88._M_impl.super__Vector_impl_data._M_start >> 3);
        uVar8 = uVar8 + 1) {
      if (freq <= local_88._M_impl.super__Vector_impl_data._M_start[uVar8]) {
        sVar2 = (local_b0->super_FeatureIndex).maxid_;
        (local_b0->super_FeatureIndex).maxid_ = sVar2 + 1;
        local_a0._M_impl.super__Vector_impl_data._M_start._0_4_ = (int)uVar8;
        local_a0._M_impl.super__Vector_impl_data._M_start._4_4_ = (int)sVar2;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<std::pair<int,int>>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)&local_60,(pair<int,_int> *)&local_a0);
      }
    }
    local_68 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
                *)&local_b0->dic_;
    pmVar3 = &local_b0->dic_;
    __position._M_node = (local_b0->dic_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)__position._M_node != &(pmVar3->_M_t)._M_impl.super__Rb_tree_header) {
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::find(&local_60,__position._M_node + 2);
      if ((_Rb_tree_header *)iVar5._M_node == p_Var1) {
        p_Var6 = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::_Select1st<std::pair<std::__cxx11::string_const,int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
        ::erase_abi_cxx11_(local_68,__position);
        __position._M_node = p_Var6;
      }
      else {
        __position._M_node[2]._M_color = *(_Rb_tree_color *)&iVar5._M_node[1].field_0x4;
        __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
      }
    }
    for (p_Var4 = *(_Rb_tree_node_base **)&local_b0->field_0x1b8;
        p_Var4 != (_Rb_tree_node_base *)&this->field_0x1a8;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      pkVar9 = *(key_type_conflict **)(p_Var4 + 2);
      for (__k = pkVar9; *__k != -1; __k = __k + 1) {
        iVar5 = std::
                _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                ::find(&local_60,__k);
        if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
          *pkVar9 = *(key_type_conflict *)&iVar5._M_node[1].field_0x4;
          pkVar9 = pkVar9 + 1;
        }
      }
      *pkVar9 = -1;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_a0,
               (local_b0->super_FeatureIndex).maxid_,(allocator_type *)&local_b4);
    for (uVar8 = 0;
        uVar8 < (ulong)((long)(local_a8->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_a8->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar8 = uVar8 + 1) {
      local_b4 = (key_type_conflict)uVar8;
      iVar5 = std::
              _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
              ::find(&local_60,&local_b4);
      if ((_Rb_tree_header *)iVar5._M_node != p_Var1) {
        *(double *)
         (CONCAT44(local_a0._M_impl.super__Vector_impl_data._M_start._4_4_,
                   (int)local_a0._M_impl.super__Vector_impl_data._M_start) +
         (long)*(int *)&iVar5._M_node[1].field_0x4 * 8) =
             (local_a8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[uVar8];
      }
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (local_a8,(vector<double,_std::allocator<double>_> *)&local_a0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_a0);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_60);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_88);
  return;
}

Assistant:

void EncoderFeatureIndex::shrink(size_t freq,
                                 std::vector<double> *observed) {
  std::vector<size_t> freqv;
  // count fvector
  freqv.resize(maxid_);
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin();
       it != feature_cache_.end(); ++it) {
    for (const int *f = it->second.first; *f != -1; ++f) {
      freqv[*f] += it->second.second;  // freq
    }
  }

  if (freq <= 1) {
    return;
  }

  // make old2new map
  maxid_ = 0;
  std::map<int, int> old2new;
  for (size_t i = 0; i < freqv.size(); ++i) {
    if (freqv[i] >= freq) {
      old2new.insert(std::pair<int, int>(i, maxid_++));
    }
  }

  // update dic_
  for (std::map<std::string, int>::iterator
           it = dic_.begin(); it != dic_.end();) {
    std::map<int, int>::const_iterator it2 = old2new.find(it->second);
    if (it2 != old2new.end()) {
      it->second = it2->second;
      ++it;
    } else {
      dic_.erase(it++);
    }
  }

  // update all fvector
  for (std::map<std::string, std::pair<const int*, size_t> >::const_iterator
           it = feature_cache_.begin(); it != feature_cache_.end(); ++it) {
    int *to = const_cast<int *>(it->second.first);
    for (const int *f = it->second.first; *f != -1; ++f) {
      std::map<int, int>::const_iterator it2 = old2new.find(*f);
      if (it2 != old2new.end()) {
        *to = it2->second;
        ++to;
      }
    }
    *to = -1;
  }

  // update observed vector
  std::vector<double> observed_new(maxid_);
  for (size_t i = 0; i < observed->size(); ++i) {
    std::map<int, int>::const_iterator it = old2new.find(static_cast<int>(i));
    if (it != old2new.end()) {
      observed_new[it->second] = (*observed)[i];
    }
  }

  // copy
  *observed = observed_new;

  return;
}